

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse2::BVHNIntersector1<4,_257,_true,_embree::sse2::VirtualCurveIntersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 (*pauVar14) [16];
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  RayQueryContext *extraout_RDX;
  ulong uVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  vfloat4 a0;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar67;
  float fVar68;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar69 [12];
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar70 [16];
  float fVar74;
  float fVar75;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar82;
  float fVar83;
  vfloat4 a;
  undefined1 auVar81 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar95;
  undefined1 auVar88 [16];
  float fVar94;
  float fVar96;
  undefined1 auVar89 [16];
  float fVar97;
  float fVar100;
  float fVar101;
  float fVar103;
  float fVar104;
  float fVar106;
  undefined1 auVar98 [16];
  float fVar102;
  float fVar105;
  float fVar107;
  undefined1 auVar99 [16];
  uint uVar108;
  uint uVar109;
  float fVar110;
  uint uVar111;
  float fVar112;
  uint uVar113;
  float fVar114;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10c8 [8];
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  ulong local_1088;
  RayHit *local_1080;
  Intersectors *local_1078;
  RayQueryContext *local_1070;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1070 = context;
  local_1078 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_fd8 = aVar2.x;
    fVar61 = aVar2.y;
    local_fc8 = aVar2.z;
    aVar67 = aVar2.field_3;
    fVar26 = fVar61 * fVar61;
    fVar27 = local_fc8 * local_fc8;
    fVar28 = aVar67.w * aVar67.w;
    fVar44 = fVar26 + local_fd8 * local_fd8 + fVar27;
    auVar51._0_8_ = CONCAT44(fVar26 + fVar26 + fVar28,fVar44);
    auVar51._8_4_ = fVar26 + fVar27 + fVar27;
    auVar51._12_4_ = fVar26 + fVar28 + fVar28;
    auVar40._8_4_ = auVar51._8_4_;
    auVar40._0_8_ = auVar51._0_8_;
    auVar40._12_4_ = auVar51._12_4_;
    auVar51 = rsqrtss(auVar40,auVar51);
    fVar26 = auVar51._0_4_;
    local_fb8[0] = fVar26 * 1.5 - fVar26 * fVar26 * fVar44 * 0.5 * fVar26;
    fVar26 = local_fd8 * local_fb8[0];
    fVar27 = fVar61 * local_fb8[0];
    fVar28 = local_fc8 * local_fb8[0];
    fVar74 = -fVar27;
    fVar44 = -fVar28;
    auVar69._8_4_ = 0xffffffff;
    auVar69._0_8_ = 0xffffffffffffffff;
    if (fVar74 * fVar74 + fVar28 * fVar28 + 0.0 <= fVar26 * fVar26 + fVar44 * fVar44 + 0.0) {
      auVar69 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar62 = (float)((uint)fVar28 & auVar69._4_4_);
    fVar44 = (float)(~auVar69._0_4_ & (uint)fVar44);
    fVar65 = (float)(~auVar69._8_4_ & (uint)fVar26 | (uint)fVar74 & auVar69._8_4_);
    fVar74 = fVar62 * fVar62;
    fVar64 = fVar65 * fVar65;
    fVar75 = fVar74 + fVar44 * fVar44 + fVar64;
    auVar77._0_8_ = CONCAT44(fVar74 + fVar74 + 0.0,fVar75);
    auVar77._8_4_ = fVar74 + fVar64 + fVar64;
    auVar77._12_4_ = fVar74 + 0.0 + 0.0;
    auVar81._8_4_ = auVar77._8_4_;
    auVar81._0_8_ = auVar77._0_8_;
    auVar81._12_4_ = auVar77._12_4_;
    auVar51 = rsqrtss(auVar81,auVar77);
    fVar74 = auVar51._0_4_;
    fVar74 = fVar74 * 1.5 - fVar74 * fVar74 * fVar75 * 0.5 * fVar74;
    fVar44 = fVar74 * fVar44;
    fVar62 = fVar74 * fVar62;
    fVar65 = fVar74 * fVar65;
    fVar64 = fVar62 * fVar26 - fVar27 * fVar44;
    fVar75 = fVar65 * fVar27 - fVar28 * fVar62;
    fVar71 = fVar44 * fVar28 - fVar26 * fVar65;
    fVar73 = fVar74 * 0.0 * aVar67.w * local_fb8[0] - aVar67.w * local_fb8[0] * fVar74 * 0.0;
    fVar74 = fVar75 * fVar75;
    fVar72 = fVar71 * fVar71;
    fVar73 = fVar73 * fVar73;
    fVar85 = fVar72 + fVar74 + fVar64 * fVar64;
    fVar86 = fVar73 + fVar74 + fVar74;
    fVar72 = fVar72 + fVar74 + fVar72;
    fVar73 = fVar73 + fVar74 + fVar73;
    auVar60._4_4_ = fVar86;
    auVar60._0_4_ = fVar85;
    auVar60._8_4_ = fVar72;
    auVar60._12_4_ = fVar73;
    auVar46._4_4_ = fVar86;
    auVar46._0_4_ = fVar85;
    auVar46._8_4_ = fVar72;
    auVar46._12_4_ = fVar73;
    auVar51 = rsqrtss(auVar60,auVar46);
    fVar74 = auVar51._0_4_;
    fVar74 = fVar74 * 1.5 - fVar74 * fVar74 * fVar85 * 0.5 * fVar74;
    local_f88._4_4_ = fVar74 * fVar64;
    local_f88._0_4_ = fVar65;
    local_f88._8_4_ = local_fb8[0] * fVar28;
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar74 * fVar71;
    local_f98._0_4_ = fVar62;
    local_f98._8_4_ = local_fb8[0] * fVar27;
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar74 * fVar75;
    local_fa8._0_4_ = fVar44;
    local_fa8._8_4_ = local_fb8[0] * fVar26;
    local_fa8._12_4_ = 0;
    pauVar20 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar27 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar28 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar44 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar74 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar26 = (ray->super_RayK<1>).tfar;
    fVar62 = 0.0;
    if (0.0 <= fVar26) {
      fVar62 = fVar26;
    }
    fVar26 = 0.0;
    if (0.0 <= fVar74) {
      fVar26 = fVar74;
    }
    auVar51 = divps(_DAT_01f7ba10,(undefined1  [16])aVar2);
    fVar87 = (float)(~-(uint)(1e-18 <= ABS(local_fd8)) & 0x5d5e0b6b |
                    auVar51._0_4_ & -(uint)(1e-18 <= ABS(local_fd8)));
    fVar90 = (float)(~-(uint)(1e-18 <= ABS(fVar61)) & 0x5d5e0b6b |
                    auVar51._4_4_ & -(uint)(1e-18 <= ABS(fVar61)));
    fVar92 = (float)(~-(uint)(1e-18 <= ABS(local_fc8)) & 0x5d5e0b6b |
                    auVar51._8_4_ & -(uint)(1e-18 <= ABS(local_fc8)));
    fVar72 = fVar87 * 0.99999964;
    fVar100 = fVar90 * 0.99999964;
    fVar103 = fVar92 * 0.99999964;
    fVar87 = fVar87 * 1.0000004;
    fVar90 = fVar90 * 1.0000004;
    fVar92 = fVar92 * 1.0000004;
    fStack_fd4 = local_fd8;
    fStack_fd0 = local_fd8;
    fStack_fcc = local_fd8;
    local_fe8._4_4_ = fVar61;
    local_fe8._0_4_ = fVar61;
    fStack_fe0 = fVar61;
    fStack_fdc = fVar61;
    fStack_fc4 = local_fc8;
    fStack_fc0 = local_fc8;
    fStack_fbc = local_fc8;
    uVar19 = (ulong)(fVar72 < 0.0) << 4;
    uVar21 = (ulong)(fVar100 < 0.0) << 4 | 0x20;
    uVar22 = (ulong)(fVar103 < 0.0) << 4 | 0x40;
    uVar18 = uVar19 ^ 0x10;
    local_1080 = ray;
    local_1008 = fVar44;
    fStack_1004 = fVar44;
    fStack_1000 = fVar44;
    fStack_ffc = fVar44;
    local_1018 = fVar26;
    fStack_1014 = fVar26;
    fStack_1010 = fVar26;
    fStack_100c = fVar26;
    local_1028 = fVar92;
    fStack_1024 = fVar92;
    fStack_1020 = fVar92;
    fStack_101c = fVar92;
    local_1038 = fVar103;
    fStack_1034 = fVar103;
    fStack_1030 = fVar103;
    fStack_102c = fVar103;
    local_1048 = fVar27;
    fStack_1044 = fVar27;
    fStack_1040 = fVar27;
    fStack_103c = fVar27;
    local_1058 = fVar28;
    fStack_1054 = fVar28;
    fStack_1050 = fVar28;
    fStack_104c = fVar28;
    local_1088 = uVar19;
    local_1068 = fVar72;
    fStack_1064 = fVar72;
    fStack_1060 = fVar72;
    fStack_105c = fVar72;
    local_1098 = fVar100;
    fStack_1094 = fVar100;
    fStack_1090 = fVar100;
    fStack_108c = fVar100;
    local_10a8 = fVar87;
    fStack_10a4 = fVar87;
    fStack_10a0 = fVar87;
    fStack_109c = fVar87;
    local_10b8 = fVar90;
    fStack_10b4 = fVar90;
    fStack_10b0 = fVar90;
    fStack_10ac = fVar90;
    fVar61 = fVar62;
    fVar74 = fVar62;
    fVar64 = fVar62;
    fVar65 = fVar26;
    fVar75 = fVar26;
    fVar71 = fVar26;
    fVar73 = fVar72;
    fVar85 = fVar72;
    fVar86 = fVar72;
    fVar114 = fVar27;
    fVar94 = fVar27;
    fVar96 = fVar27;
    fVar97 = fVar28;
    fVar102 = fVar28;
    fVar105 = fVar28;
    fVar107 = fVar44;
    fVar110 = fVar44;
    fVar112 = fVar44;
    fVar63 = fVar90;
    fVar66 = fVar90;
    fVar68 = fVar90;
    fVar78 = fVar100;
    fVar79 = fVar100;
    fVar80 = fVar100;
    fVar82 = fVar87;
    fVar83 = fVar87;
    fVar84 = fVar87;
    fVar91 = fVar92;
    fVar93 = fVar92;
    fVar95 = fVar92;
    fVar101 = fVar103;
    fVar104 = fVar103;
    fVar106 = fVar103;
    do {
      pauVar14 = pauVar20 + -1;
      pauVar20 = pauVar20 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar14 + 8) < *pfVar1 || *(float *)((long)*pauVar14 + 8) == *pfVar1) {
        uVar15 = *(ulong *)*pauVar20;
LAB_00cffa53:
        if ((uVar15 & 0xf) == 0) {
          pfVar1 = (float *)(uVar15 + 0x20 + uVar19);
          auVar29._0_4_ = (*pfVar1 - fVar27) * fVar72;
          auVar29._4_4_ = (pfVar1[1] - fVar114) * fVar73;
          auVar29._8_4_ = (pfVar1[2] - fVar94) * fVar85;
          auVar29._12_4_ = (pfVar1[3] - fVar96) * fVar86;
          pfVar1 = (float *)(uVar15 + 0x20 + uVar21);
          auVar38._0_4_ = (*pfVar1 - fVar28) * fVar100;
          auVar38._4_4_ = (pfVar1[1] - fVar97) * fVar78;
          auVar38._8_4_ = (pfVar1[2] - fVar102) * fVar79;
          auVar38._12_4_ = (pfVar1[3] - fVar105) * fVar80;
          auVar51 = maxps(auVar29,auVar38);
          pfVar1 = (float *)(uVar15 + 0x20 + uVar22);
          auVar39._0_4_ = (*pfVar1 - fVar44) * fVar103;
          auVar39._4_4_ = (pfVar1[1] - fVar107) * fVar101;
          auVar39._8_4_ = (pfVar1[2] - fVar110) * fVar104;
          auVar39._12_4_ = (pfVar1[3] - fVar112) * fVar106;
          pfVar1 = (float *)(uVar15 + 0x20 + uVar18);
          auVar45._0_4_ = (*pfVar1 - fVar27) * fVar87;
          auVar45._4_4_ = (pfVar1[1] - fVar114) * fVar82;
          auVar45._8_4_ = (pfVar1[2] - fVar94) * fVar83;
          auVar45._12_4_ = (pfVar1[3] - fVar96) * fVar84;
          pfVar1 = (float *)(uVar15 + 0x20 + (uVar21 ^ 0x10));
          auVar52._0_4_ = (*pfVar1 - fVar28) * fVar90;
          auVar52._4_4_ = (pfVar1[1] - fVar97) * fVar63;
          auVar52._8_4_ = (pfVar1[2] - fVar102) * fVar66;
          auVar52._12_4_ = (pfVar1[3] - fVar105) * fVar68;
          auVar46 = minps(auVar45,auVar52);
          pfVar1 = (float *)(uVar15 + 0x20 + (uVar22 ^ 0x10));
          auVar53._0_4_ = (*pfVar1 - fVar44) * fVar92;
          auVar53._4_4_ = (pfVar1[1] - fVar107) * fVar91;
          auVar53._8_4_ = (pfVar1[2] - fVar110) * fVar93;
          auVar53._12_4_ = (pfVar1[3] - fVar112) * fVar95;
          auVar8._4_4_ = fVar65;
          auVar8._0_4_ = fVar26;
          auVar8._8_4_ = fVar75;
          auVar8._12_4_ = fVar71;
          auVar40 = maxps(auVar39,auVar8);
          _local_10c8 = maxps(auVar51,auVar40);
          auVar7._4_4_ = fVar61;
          auVar7._0_4_ = fVar62;
          auVar7._8_4_ = fVar74;
          auVar7._12_4_ = fVar64;
          auVar51 = minps(auVar53,auVar7);
          auVar51 = minps(auVar46,auVar51);
          auVar30._4_4_ = -(uint)(local_10c8._4_4_ <= auVar51._4_4_);
          auVar30._0_4_ = -(uint)(local_10c8._0_4_ <= auVar51._0_4_);
          auVar30._8_4_ = -(uint)(local_10c8._8_4_ <= auVar51._8_4_);
          auVar30._12_4_ = -(uint)(local_10c8._12_4_ <= auVar51._12_4_);
          uVar17 = movmskps((int)context,auVar30);
        }
        else {
          if ((int)(uVar15 & 0xf) != 2) {
            (**(code **)((long)local_1078->leafIntersector +
                        (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40))
                      (local_fb8,ray,local_1070);
            fVar62 = (local_1080->super_RayK<1>).tfar;
            context = extraout_RDX;
            ray = local_1080;
            uVar19 = local_1088;
            fVar61 = fVar62;
            fVar74 = fVar62;
            fVar64 = fVar62;
            fVar26 = local_1018;
            fVar65 = fStack_1014;
            fVar75 = fStack_1010;
            fVar71 = fStack_100c;
            fVar72 = local_1068;
            fVar73 = fStack_1064;
            fVar85 = fStack_1060;
            fVar86 = fStack_105c;
            fVar27 = local_1048;
            fVar114 = fStack_1044;
            fVar94 = fStack_1040;
            fVar96 = fStack_103c;
            fVar28 = local_1058;
            fVar97 = fStack_1054;
            fVar102 = fStack_1050;
            fVar105 = fStack_104c;
            fVar44 = local_1008;
            fVar107 = fStack_1004;
            fVar110 = fStack_1000;
            fVar112 = fStack_ffc;
            fVar90 = local_10b8;
            fVar63 = fStack_10b4;
            fVar66 = fStack_10b0;
            fVar68 = fStack_10ac;
            fVar100 = local_1098;
            fVar78 = fStack_1094;
            fVar79 = fStack_1090;
            fVar80 = fStack_108c;
            fVar87 = local_10a8;
            fVar82 = fStack_10a4;
            fVar83 = fStack_10a0;
            fVar84 = fStack_109c;
            fVar92 = local_1028;
            fVar91 = fStack_1024;
            fVar93 = fStack_1020;
            fVar95 = fStack_101c;
            fVar103 = local_1038;
            fVar101 = fStack_1034;
            fVar104 = fStack_1030;
            fVar106 = fStack_102c;
            goto LAB_00d000ab;
          }
          uVar16 = uVar15 & 0xfffffffffffffff0;
          local_ff8 = *(float *)(uVar16 + 0x70);
          fStack_ff4 = *(float *)(uVar16 + 0x74);
          fStack_ff0 = *(float *)(uVar16 + 0x78);
          fStack_fec = *(float *)(uVar16 + 0x7c);
          fVar73 = local_fd8 * *(float *)(uVar16 + 0x20) +
                   (float)local_fe8._0_4_ * *(float *)(uVar16 + 0x50) +
                   local_fc8 * *(float *)(uVar16 + 0x80);
          fVar85 = fStack_fd4 * *(float *)(uVar16 + 0x24) +
                   (float)local_fe8._4_4_ * *(float *)(uVar16 + 0x54) +
                   fStack_fc4 * *(float *)(uVar16 + 0x84);
          fVar86 = fStack_fd0 * *(float *)(uVar16 + 0x28) +
                   fStack_fe0 * *(float *)(uVar16 + 0x58) + fStack_fc0 * *(float *)(uVar16 + 0x88);
          fVar114 = fStack_fcc * *(float *)(uVar16 + 0x2c) +
                    fStack_fdc * *(float *)(uVar16 + 0x5c) + fStack_fbc * *(float *)(uVar16 + 0x8c);
          fVar26 = local_fd8 * *(float *)(uVar16 + 0x30) +
                   (float)local_fe8._0_4_ * *(float *)(uVar16 + 0x60) +
                   local_fc8 * *(float *)(uVar16 + 0x90);
          fVar27 = fStack_fd4 * *(float *)(uVar16 + 0x34) +
                   (float)local_fe8._4_4_ * *(float *)(uVar16 + 100) +
                   fStack_fc4 * *(float *)(uVar16 + 0x94);
          fVar28 = fStack_fd0 * *(float *)(uVar16 + 0x38) +
                   fStack_fe0 * *(float *)(uVar16 + 0x68) + fStack_fc0 * *(float *)(uVar16 + 0x98);
          fVar44 = fStack_fcc * *(float *)(uVar16 + 0x3c) +
                   fStack_fdc * *(float *)(uVar16 + 0x6c) + fStack_fbc * *(float *)(uVar16 + 0x9c);
          fVar65 = local_fd8 * *(float *)(uVar16 + 0x40) +
                   (float)local_fe8._0_4_ * local_ff8 + local_fc8 * *(float *)(uVar16 + 0xa0);
          fVar75 = fStack_fd4 * *(float *)(uVar16 + 0x44) +
                   (float)local_fe8._4_4_ * fStack_ff4 + fStack_fc4 * *(float *)(uVar16 + 0xa4);
          fVar71 = fStack_fd0 * *(float *)(uVar16 + 0x48) +
                   fStack_fe0 * fStack_ff0 + fStack_fc0 * *(float *)(uVar16 + 0xa8);
          fVar72 = fStack_fcc * *(float *)(uVar16 + 0x4c) +
                   fStack_fdc * fStack_fec + fStack_fbc * *(float *)(uVar16 + 0xac);
          uVar108 = (uint)DAT_01f7b6c0;
          uVar109 = DAT_01f7b6c0._4_4_;
          uVar111 = DAT_01f7b6c0._8_4_;
          uVar113 = DAT_01f7b6c0._12_4_;
          uVar17 = -(uint)(1e-18 <= (float)((uint)fVar73 & uVar108));
          uVar23 = -(uint)(1e-18 <= (float)((uint)fVar85 & uVar109));
          uVar24 = -(uint)(1e-18 <= (float)((uint)fVar86 & uVar111));
          uVar25 = -(uint)(1e-18 <= (float)((uint)fVar114 & uVar113));
          auVar88._0_8_ = CONCAT44(~uVar23,~uVar17) & 0x219392ef219392ef;
          auVar88._8_4_ = ~uVar24 & 0x219392ef;
          auVar88._12_4_ = ~uVar25 & 0x219392ef;
          auVar12._4_4_ = (uint)fVar85 & uVar23;
          auVar12._0_4_ = (uint)fVar73 & uVar17;
          auVar12._8_4_ = (uint)fVar86 & uVar24;
          auVar12._12_4_ = (uint)fVar114 & uVar25;
          auVar88 = auVar88 | auVar12;
          uVar17 = -(uint)(1e-18 <= (float)((uint)fVar26 & uVar108));
          uVar23 = -(uint)(1e-18 <= (float)((uint)fVar27 & uVar109));
          uVar24 = -(uint)(1e-18 <= (float)((uint)fVar28 & uVar111));
          uVar25 = -(uint)(1e-18 <= (float)((uint)fVar44 & uVar113));
          auVar31._0_4_ = (uint)fVar26 & uVar17;
          auVar31._4_4_ = (uint)fVar27 & uVar23;
          auVar31._8_4_ = (uint)fVar28 & uVar24;
          auVar31._12_4_ = (uint)fVar44 & uVar25;
          auVar98._0_8_ = CONCAT44(~uVar23,~uVar17) & 0x219392ef219392ef;
          auVar98._8_4_ = ~uVar24 & 0x219392ef;
          auVar98._12_4_ = ~uVar25 & 0x219392ef;
          auVar98 = auVar98 | auVar31;
          uVar17 = -(uint)(1e-18 <= (float)((uint)fVar65 & uVar108));
          uVar23 = -(uint)(1e-18 <= (float)((uint)fVar75 & uVar109));
          uVar24 = -(uint)(1e-18 <= (float)((uint)fVar71 & uVar111));
          uVar25 = -(uint)(1e-18 <= (float)((uint)fVar72 & uVar113));
          auVar32._0_8_ = CONCAT44(~uVar23,~uVar17) & 0x219392ef219392ef;
          auVar32._8_4_ = ~uVar24 & 0x219392ef;
          auVar32._12_4_ = ~uVar25 & 0x219392ef;
          auVar9._4_4_ = (uint)fVar75 & uVar23;
          auVar9._0_4_ = (uint)fVar65 & uVar17;
          auVar9._8_4_ = (uint)fVar71 & uVar24;
          auVar9._12_4_ = (uint)fVar72 & uVar25;
          auVar32 = auVar32 | auVar9;
          auVar51 = rcpps(_DAT_01f7b6c0,auVar88);
          fVar71 = auVar51._0_4_;
          fVar72 = auVar51._4_4_;
          fVar73 = auVar51._8_4_;
          fVar85 = auVar51._12_4_;
          fVar71 = (1.0 - auVar88._0_4_ * fVar71) * fVar71 + fVar71;
          fVar72 = (1.0 - auVar88._4_4_ * fVar72) * fVar72 + fVar72;
          fVar73 = (1.0 - auVar88._8_4_ * fVar73) * fVar73 + fVar73;
          fVar85 = (1.0 - auVar88._12_4_ * fVar85) * fVar85 + fVar85;
          auVar51 = rcpps(auVar51,auVar98);
          fVar86 = auVar51._0_4_;
          fVar114 = auVar51._4_4_;
          fVar94 = auVar51._8_4_;
          fVar96 = auVar51._12_4_;
          fVar86 = (1.0 - auVar98._0_4_ * fVar86) * fVar86 + fVar86;
          fVar114 = (1.0 - auVar98._4_4_ * fVar114) * fVar114 + fVar114;
          fVar94 = (1.0 - auVar98._8_4_ * fVar94) * fVar94 + fVar94;
          fVar96 = (1.0 - auVar98._12_4_ * fVar96) * fVar96 + fVar96;
          auVar51 = rcpps(auVar51,auVar32);
          fVar97 = auVar51._0_4_;
          fVar102 = auVar51._4_4_;
          fVar105 = auVar51._8_4_;
          fVar107 = auVar51._12_4_;
          fVar97 = (1.0 - auVar32._0_4_ * fVar97) * fVar97 + fVar97;
          fVar102 = (1.0 - auVar32._4_4_ * fVar102) * fVar102 + fVar102;
          fVar105 = (1.0 - auVar32._8_4_ * fVar105) * fVar105 + fVar105;
          fVar107 = (1.0 - auVar32._12_4_ * fVar107) * fVar107 + fVar107;
          uVar17 = (uint)DAT_01f7b6d0;
          uVar23 = DAT_01f7b6d0._4_4_;
          uVar24 = DAT_01f7b6d0._8_4_;
          uVar25 = DAT_01f7b6d0._12_4_;
          fVar65 = (*(float *)(uVar16 + 0x20) * local_1048 +
                   *(float *)(uVar16 + 0x50) * local_1058 +
                   *(float *)(uVar16 + 0x80) * local_1008 + *(float *)(uVar16 + 0xb0)) *
                   (float)((uint)fVar71 ^ uVar17);
          fVar75 = (*(float *)(uVar16 + 0x24) * fStack_1044 +
                   *(float *)(uVar16 + 0x54) * fStack_1054 +
                   *(float *)(uVar16 + 0x84) * fStack_1004 + *(float *)(uVar16 + 0xb4)) *
                   (float)((uint)fVar72 ^ uVar23);
          auVar58._0_8_ = CONCAT44(fVar75,fVar65);
          auVar58._8_4_ =
               (*(float *)(uVar16 + 0x28) * fStack_1040 +
               *(float *)(uVar16 + 0x58) * fStack_1050 +
               *(float *)(uVar16 + 0x88) * fStack_1000 + *(float *)(uVar16 + 0xb8)) *
               (float)((uint)fVar73 ^ uVar24);
          auVar58._12_4_ =
               (*(float *)(uVar16 + 0x2c) * fStack_103c +
               *(float *)(uVar16 + 0x5c) * fStack_104c +
               *(float *)(uVar16 + 0x8c) * fStack_ffc + *(float *)(uVar16 + 0xbc)) *
               (float)((uint)fVar85 ^ uVar25);
          fVar26 = (*(float *)(uVar16 + 0x30) * local_1048 +
                   *(float *)(uVar16 + 0x60) * local_1058 +
                   *(float *)(uVar16 + 0x90) * local_1008 + *(float *)(uVar16 + 0xc0)) *
                   (float)((uint)fVar86 ^ uVar17);
          fVar27 = (*(float *)(uVar16 + 0x34) * fStack_1044 +
                   *(float *)(uVar16 + 100) * fStack_1054 +
                   *(float *)(uVar16 + 0x94) * fStack_1004 + *(float *)(uVar16 + 0xc4)) *
                   (float)((uint)fVar114 ^ uVar23);
          auVar41._0_8_ = CONCAT44(fVar27,fVar26);
          auVar41._8_4_ =
               (*(float *)(uVar16 + 0x38) * fStack_1040 +
               *(float *)(uVar16 + 0x68) * fStack_1050 +
               *(float *)(uVar16 + 0x98) * fStack_1000 + *(float *)(uVar16 + 200)) *
               (float)((uint)fVar94 ^ uVar24);
          auVar41._12_4_ =
               (*(float *)(uVar16 + 0x3c) * fStack_103c +
               *(float *)(uVar16 + 0x6c) * fStack_104c +
               *(float *)(uVar16 + 0x9c) * fStack_ffc + *(float *)(uVar16 + 0xcc)) *
               (float)((uint)fVar96 ^ uVar25);
          fVar28 = (*(float *)(uVar16 + 0x40) * local_1048 +
                   local_ff8 * local_1058 +
                   *(float *)(uVar16 + 0xa0) * local_1008 + *(float *)(uVar16 + 0xd0)) *
                   (float)((uint)fVar97 ^ uVar17);
          fVar44 = (*(float *)(uVar16 + 0x44) * fStack_1044 +
                   fStack_ff4 * fStack_1054 +
                   *(float *)(uVar16 + 0xa4) * fStack_1004 + *(float *)(uVar16 + 0xd4)) *
                   (float)((uint)fVar102 ^ uVar23);
          auVar47._0_8_ = CONCAT44(fVar44,fVar28);
          auVar47._8_4_ =
               (*(float *)(uVar16 + 0x48) * fStack_1040 +
               fStack_ff0 * fStack_1050 +
               *(float *)(uVar16 + 0xa8) * fStack_1000 + *(float *)(uVar16 + 0xd8)) *
               (float)((uint)fVar105 ^ uVar24);
          auVar47._12_4_ =
               (*(float *)(uVar16 + 0x4c) * fStack_103c +
               fStack_fec * fStack_104c +
               *(float *)(uVar16 + 0xac) * fStack_ffc + *(float *)(uVar16 + 0xdc)) *
               (float)((uint)fVar107 ^ uVar25);
          fVar71 = fVar71 + fVar65;
          fVar72 = fVar72 + fVar75;
          fVar73 = fVar73 + auVar58._8_4_;
          fVar85 = fVar85 + auVar58._12_4_;
          auVar89._0_4_ = fVar86 + fVar26;
          auVar89._4_4_ = fVar114 + fVar27;
          auVar89._8_4_ = fVar94 + auVar41._8_4_;
          auVar89._12_4_ = fVar96 + auVar41._12_4_;
          auVar99._0_4_ = fVar97 + fVar28;
          auVar99._4_4_ = fVar102 + fVar44;
          auVar99._8_4_ = fVar105 + auVar47._8_4_;
          auVar99._12_4_ = fVar107 + auVar47._12_4_;
          auVar33._8_4_ = auVar41._8_4_;
          auVar33._0_8_ = auVar41._0_8_;
          auVar33._12_4_ = auVar41._12_4_;
          auVar51 = minps(auVar33,auVar89);
          auVar54._8_4_ = auVar47._8_4_;
          auVar54._0_8_ = auVar47._0_8_;
          auVar54._12_4_ = auVar47._12_4_;
          auVar40 = minps(auVar54,auVar99);
          auVar51 = maxps(auVar51,auVar40);
          auVar55._8_4_ = auVar58._8_4_;
          auVar55._0_8_ = auVar58._0_8_;
          auVar55._12_4_ = auVar58._12_4_;
          auVar10._4_4_ = fVar72;
          auVar10._0_4_ = fVar71;
          auVar10._8_4_ = fVar73;
          auVar10._12_4_ = fVar85;
          auVar60 = minps(auVar55,auVar10);
          auVar11._4_4_ = fVar72;
          auVar11._0_4_ = fVar71;
          auVar11._8_4_ = fVar73;
          auVar11._12_4_ = fVar85;
          auVar77 = maxps(auVar58,auVar11);
          auVar40 = maxps(auVar41,auVar89);
          auVar46 = maxps(auVar47,auVar99);
          auVar40 = minps(auVar40,auVar46);
          auVar13._4_4_ = fStack_1014;
          auVar13._0_4_ = local_1018;
          auVar13._8_4_ = fStack_1010;
          auVar13._12_4_ = fStack_100c;
          auVar46 = maxps(auVar13,auVar60);
          auVar46 = maxps(auVar46,auVar51);
          auVar34._4_4_ = fVar61;
          auVar34._0_4_ = fVar62;
          auVar34._8_4_ = fVar74;
          auVar34._12_4_ = fVar64;
          auVar51 = minps(auVar34,auVar77);
          auVar51 = minps(auVar51,auVar40);
          local_10c8._0_4_ = auVar46._0_4_ * 0.99999964;
          local_10c8._4_4_ = auVar46._4_4_ * 0.99999964;
          fStack_10c0 = auVar46._8_4_ * 0.99999964;
          fStack_10bc = auVar46._12_4_ * 0.99999964;
          auVar48._4_4_ = -(uint)((float)local_10c8._4_4_ <= auVar51._4_4_ * 1.0000004);
          auVar48._0_4_ = -(uint)((float)local_10c8._0_4_ <= auVar51._0_4_ * 1.0000004);
          auVar48._8_4_ = -(uint)(fStack_10c0 <= auVar51._8_4_ * 1.0000004);
          auVar48._12_4_ = -(uint)(fStack_10bc <= auVar51._12_4_ * 1.0000004);
          uVar17 = movmskps((int)context,auVar48);
          fVar26 = local_1018;
          fVar65 = fStack_1014;
          fVar75 = fStack_1010;
          fVar71 = fStack_100c;
          fVar72 = local_1068;
          fVar73 = fStack_1064;
          fVar85 = fStack_1060;
          fVar86 = fStack_105c;
          fVar27 = local_1048;
          fVar114 = fStack_1044;
          fVar94 = fStack_1040;
          fVar96 = fStack_103c;
          fVar28 = local_1058;
          fVar97 = fStack_1054;
          fVar102 = fStack_1050;
          fVar105 = fStack_104c;
          fVar44 = local_1008;
          fVar107 = fStack_1004;
          fVar110 = fStack_1000;
          fVar112 = fStack_ffc;
          fVar90 = local_10b8;
          fVar63 = fStack_10b4;
          fVar66 = fStack_10b0;
          fVar68 = fStack_10ac;
          fVar100 = local_1098;
          fVar78 = fStack_1094;
          fVar79 = fStack_1090;
          fVar80 = fStack_108c;
          fVar87 = local_10a8;
          fVar82 = fStack_10a4;
          fVar83 = fStack_10a0;
          fVar84 = fStack_109c;
          fVar92 = local_1028;
          fVar91 = fStack_1024;
          fVar93 = fStack_1020;
          fVar95 = fStack_101c;
          fVar103 = local_1038;
          fVar101 = fStack_1034;
          fVar104 = fStack_1030;
          fVar106 = fStack_102c;
        }
        context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar17);
        if (context == (RayQueryContext *)0x0) goto LAB_00d000ab;
        uVar16 = uVar15 & 0xfffffffffffffff0;
        lVar6 = 0;
        if (context != (RayQueryContext *)0x0) {
          for (; ((ulong)context >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        uVar15 = *(ulong *)(uVar16 + lVar6 * 8);
        uVar17 = uVar17 - 1 & uVar17;
        if (uVar17 != 0) {
          uVar23 = *(uint *)(local_10c8 + lVar6 * 4);
          lVar6 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar5 = *(ulong *)(uVar16 + lVar6 * 8);
          uVar24 = *(uint *)(local_10c8 + lVar6 * 4);
          uVar17 = uVar17 - 1 & uVar17;
          context = (RayQueryContext *)(ulong)uVar17;
          if (uVar17 == 0) {
            if (uVar23 < uVar24) {
              *(ulong *)*pauVar20 = uVar5;
              *(uint *)((long)*pauVar20 + 8) = uVar24;
              pauVar20 = pauVar20 + 1;
            }
            else {
              *(ulong *)*pauVar20 = uVar15;
              *(uint *)((long)*pauVar20 + 8) = uVar23;
              uVar15 = uVar5;
              pauVar20 = pauVar20 + 1;
            }
          }
          else {
            auVar35._8_4_ = uVar23;
            auVar35._0_8_ = uVar15;
            auVar35._12_4_ = 0;
            auVar42._8_4_ = uVar24;
            auVar42._0_8_ = uVar5;
            auVar42._12_4_ = 0;
            lVar6 = 0;
            if (context != (RayQueryContext *)0x0) {
              for (; (uVar17 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
              }
            }
            uVar15 = *(ulong *)(uVar16 + lVar6 * 8);
            iVar3 = *(int *)(local_10c8 + lVar6 * 4);
            auVar49._8_4_ = iVar3;
            auVar49._0_8_ = uVar15;
            auVar49._12_4_ = 0;
            uVar17 = uVar17 - 1 & uVar17;
            if (uVar17 == 0) {
              auVar56._8_4_ = -(uint)((int)uVar23 < (int)uVar24);
              auVar56._4_4_ = auVar56._8_4_;
              auVar56._0_4_ = auVar56._8_4_;
              auVar56._12_4_ = auVar56._8_4_;
              auVar51 = auVar35 & auVar56 | ~auVar56 & auVar42;
              auVar40 = auVar42 & auVar56 | ~auVar56 & auVar35;
              auVar57._8_4_ = -(uint)(auVar51._8_4_ < iVar3);
              auVar57._0_8_ = CONCAT44(auVar57._8_4_,auVar57._8_4_);
              auVar57._12_4_ = auVar57._8_4_;
              uVar15 = ~auVar57._0_8_ & uVar15 | auVar51._0_8_ & auVar57._0_8_;
              auVar51 = auVar49 & auVar57 | ~auVar57 & auVar51;
              auVar36._8_4_ = -(uint)(auVar40._8_4_ < auVar51._8_4_);
              auVar36._4_4_ = auVar36._8_4_;
              auVar36._0_4_ = auVar36._8_4_;
              auVar36._12_4_ = auVar36._8_4_;
              *pauVar20 = ~auVar36 & auVar40 | auVar51 & auVar36;
              pauVar20[1] = auVar40 & auVar36 | ~auVar36 & auVar51;
              pauVar20 = pauVar20 + 2;
              fVar90 = local_10b8;
              fVar63 = fStack_10b4;
              fVar66 = fStack_10b0;
              fVar68 = fStack_10ac;
            }
            else {
              lVar6 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              iVar4 = *(int *)(local_10c8 + lVar6 * 4);
              auVar59._8_4_ = iVar4;
              auVar59._0_8_ = *(undefined8 *)(uVar16 + lVar6 * 8);
              auVar59._12_4_ = 0;
              auVar70._8_4_ = -(uint)((int)uVar23 < (int)uVar24);
              auVar70._4_4_ = auVar70._8_4_;
              auVar70._0_4_ = auVar70._8_4_;
              auVar70._12_4_ = auVar70._8_4_;
              auVar51 = auVar35 & auVar70 | ~auVar70 & auVar42;
              auVar40 = auVar42 & auVar70 | ~auVar70 & auVar35;
              auVar76._0_4_ = -(uint)(iVar3 < iVar4);
              auVar76._4_4_ = -(uint)(iVar3 < iVar4);
              auVar76._8_4_ = -(uint)(iVar3 < iVar4);
              auVar76._12_4_ = -(uint)(iVar3 < iVar4);
              auVar46 = auVar49 & auVar76 | ~auVar76 & auVar59;
              auVar77 = ~auVar76 & auVar49 | auVar59 & auVar76;
              auVar50._8_4_ = -(uint)(auVar40._8_4_ < auVar77._8_4_);
              auVar50._4_4_ = auVar50._8_4_;
              auVar50._0_4_ = auVar50._8_4_;
              auVar50._12_4_ = auVar50._8_4_;
              auVar60 = auVar40 & auVar50 | ~auVar50 & auVar77;
              auVar43._8_4_ = -(uint)(auVar51._8_4_ < auVar46._8_4_);
              auVar43._0_8_ = CONCAT44(auVar43._8_4_,auVar43._8_4_);
              auVar43._12_4_ = auVar43._8_4_;
              uVar15 = auVar51._0_8_ & auVar43._0_8_ | ~auVar43._0_8_ & auVar46._0_8_;
              auVar51 = ~auVar43 & auVar51 | auVar46 & auVar43;
              auVar37._8_4_ = -(uint)(auVar51._8_4_ < auVar60._8_4_);
              auVar37._4_4_ = auVar37._8_4_;
              auVar37._0_4_ = auVar37._8_4_;
              auVar37._12_4_ = auVar37._8_4_;
              *pauVar20 = ~auVar50 & auVar40 | auVar77 & auVar50;
              pauVar20[1] = ~auVar37 & auVar51 | auVar60 & auVar37;
              pauVar20[2] = auVar51 & auVar37 | ~auVar37 & auVar60;
              pauVar20 = pauVar20 + 3;
              fVar90 = local_10b8;
              fVar63 = fStack_10b4;
              fVar66 = fStack_10b0;
              fVar68 = fStack_10ac;
              fVar100 = local_1098;
              fVar78 = fStack_1094;
              fVar79 = fStack_1090;
              fVar80 = fStack_108c;
              fVar87 = local_10a8;
              fVar82 = fStack_10a4;
              fVar83 = fStack_10a0;
              fVar84 = fStack_109c;
            }
          }
        }
        goto LAB_00cffa53;
      }
LAB_00d000ab:
    } while (pauVar20 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }